

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_&>::flattenTo
          (Delimited<kj::ArrayPtr<void_*const>_&> *this,char *target,char *limit)

{
  void **ppvVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  void **elem;
  void **ppvVar6;
  CappedArray<char,_17UL> local_50;
  
  sVar2 = this->array->size_;
  if (sVar2 != 0) {
    ppvVar6 = this->array->ptr;
    ppvVar1 = ppvVar6 + sVar2;
    bVar3 = true;
    do {
      if (target == limit) {
        return target;
      }
      if (!bVar3) {
        pcVar5 = (this->delimiter).content.ptr;
        sVar2 = (this->delimiter).content.size_;
        if (pcVar5 != pcVar5 + (sVar2 - 1)) {
          lVar4 = 1;
          do {
            *target = pcVar5[lVar4 + -1];
            target = target + 1;
            if ((2 - sVar2) + lVar4 == 1) break;
            lVar4 = lVar4 + 1;
          } while (target != limit);
        }
      }
      Stringifier::operator*(&local_50,(Stringifier *)&_::STR,*ppvVar6);
      if (target != limit && local_50.currentSize != 0) {
        pcVar5 = (char *)(local_50.currentSize - 1);
        if (limit + ~(ulong)target < (char *)(local_50.currentSize - 1)) {
          pcVar5 = limit + ~(ulong)target;
        }
        memcpy(target,local_50.content,(size_t)(pcVar5 + 1));
        target = target + (long)pcVar5 + 1;
      }
      ppvVar6 = ppvVar6 + 1;
      bVar3 = false;
    } while (ppvVar6 != ppvVar1);
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }